

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O0

int Aig_ObjFindSatAssign(Aig_Man_t *pAig,Aig_Obj_t *pNode,int Value,Vec_Int_t *vSuppLits)

{
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pNode_00;
  int local_34;
  int i;
  Vec_Int_t *vSuppLits_local;
  int Value_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsCo(pNode);
  if (iVar1 == 0) {
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      Vec_IntClear(vSuppLits);
      Aig_ManIncrementTravId(pAig);
      iVar1 = Aig_NtkFindSatAssign_rec(pAig,pNode,Value,vSuppLits,local_34);
      if (iVar1 != 0) {
        return 1;
      }
    }
    pAig_local._4_4_ = 0;
  }
  else {
    pNode_00 = Aig_ObjFanin0(pNode);
    uVar2 = Aig_ObjFaninC0(pNode);
    pAig_local._4_4_ = Aig_ObjFindSatAssign(pAig,pNode_00,Value ^ uVar2,vSuppLits);
  }
  return pAig_local._4_4_;
}

Assistant:

int Aig_ObjFindSatAssign( Aig_Man_t * pAig, Aig_Obj_t * pNode, int Value, Vec_Int_t * vSuppLits )
{
    int i;
    if ( Aig_ObjIsCo(pNode) )
        return Aig_ObjFindSatAssign( pAig, Aig_ObjFanin0(pNode), Value ^ Aig_ObjFaninC0(pNode), vSuppLits );
    for ( i = 0; i < 8; i++ )
    {
        Vec_IntClear( vSuppLits );
        Aig_ManIncrementTravId( pAig );
        if ( Aig_NtkFindSatAssign_rec( pAig, pNode, Value, vSuppLits, i ) )
            return 1;
    }
    return 0;
}